

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprFor * AnalyzeForEach(ExpressionContext *ctx,SynForEach *syntax)

{
  uint uVar1;
  uint uVar2;
  ModuleData *pMVar3;
  ScopeData *pSVar4;
  ExprBase *pEVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  SynBase *pSVar10;
  ExprBase *pEVar11;
  TypeBase *pTVar12;
  SynIdentifier *pSVar13;
  undefined4 extraout_var_00;
  _func_int **pp_Var14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TypeRef *pTVar15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  VariableData *pVVar16;
  ExprBase *pEVar17;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ExprBase *pEVar18;
  VariableData *pVVar19;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  ExprBase *pEVar20;
  undefined4 extraout_var_28;
  ExprBase *pEVar21;
  ExprFor *pEVar22;
  char *__function;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> *this;
  ExprBase *in_R8;
  TypeBase *pTVar23;
  ExpressionContext *ctx_00;
  ulong uVar24;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  TypeBase *local_128;
  IntrusiveList<ExprBase> initializers;
  SmallArray<VariableData_*,_4U> iterators;
  IntrusiveList<ExprBase> definitions;
  IntrusiveList<ExprBase> conditions;
  undefined4 local_8f;
  undefined3 uStack_8b;
  IntrusiveList<ExprBase> increments;
  SmallArray<ArgumentData,_1U> arguments;
  VariableHandle *variable;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_14;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  initializers.head = (ExprBase *)0x0;
  initializers.tail = (ExprBase *)0x0;
  conditions.head = (ExprBase *)0x0;
  conditions.tail = (ExprBase *)0x0;
  definitions.head = (ExprBase *)0x0;
  definitions.tail = (ExprBase *)0x0;
  increments.head = (ExprBase *)0x0;
  increments.tail = (ExprBase *)0x0;
  iterators.allocator = ctx->allocator;
  iterators.data = iterators.little;
  iterators.count = 0;
  iterators.max = 4;
  ctx_00 = (ExpressionContext *)(syntax->iterators).head;
  while (ctx_00 != (ExpressionContext *)0x0) {
    pSVar10 = &ExpressionContext::MakeInternal(ctx,(SynBase *)ctx_00)->super_SynBase;
    pEVar11 = AnalyzeExpression(ctx,(SynBase *)(ctx_00->uniqueDependencies).little[4]);
    if ((pEVar11->type == (TypeBase *)0x0) || (pEVar11->type->typeID != 0)) {
      pMVar3 = (ctx_00->uniqueDependencies).little[2];
      if (pMVar3 == (ModuleData *)0x0) {
        local_128 = (TypeBase *)0x0;
      }
      else {
        local_128 = AnalyzeType(ctx,(SynBase *)pMVar3,true,(bool *)0x0);
      }
      if ((local_128 != (TypeBase *)0x0) && (local_128->typeID == 0)) goto LAB_00184928;
      pTVar23 = pEVar11->type;
      if ((pTVar23 != (TypeBase *)0x0) &&
         ((pTVar23->typeID == 0x13 || ((pTVar23 != (TypeBase *)0x0 && (pTVar23->typeID == 0x14))))))
      {
        if ((local_128 == (TypeBase *)0x0) || (local_128 == ctx->typeAuto)) {
          if ((pTVar23 == (TypeBase *)0x0) || (pTVar12 = pTVar23, pTVar23->typeID != 0x13)) {
            pTVar12 = (TypeBase *)0x0;
          }
          if (pTVar12 == (TypeBase *)0x0) {
            if ((pTVar23 == (TypeBase *)0x0) || (pTVar12 = pTVar23, pTVar23->typeID != 0x14)) {
              pTVar12 = (TypeBase *)0x0;
            }
            if (pTVar12 == (TypeBase *)0x0) goto LAB_00184d18;
            pTVar12 = (TypeBase *)&pTVar12[1].typeIndex;
          }
          else {
            pTVar12 = pTVar12 + 1;
          }
          local_128 = (TypeBase *)pTVar12->_vptr_TypeBase;
        }
LAB_00184d18:
        if ((pEVar11 == (ExprBase *)0x0) || (pEVar17 = pEVar11, pEVar11->typeID != 0x22)) {
          pEVar17 = (ExprBase *)0x0;
        }
        if (pEVar17 == (ExprBase *)0x0) {
          if (((pEVar11 == (ExprBase *)0x0) || (pEVar11->typeID != 0x16)) &&
             ((pTVar23 == (TypeBase *)0x0 || (pTVar23->typeID != 0x12)))) {
            pVVar16 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,pEVar11->source,pTVar23);
            pSVar10 = pEVar11->source;
            pEVar17 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
            pEVar17 = CreateAssignment(ctx,pSVar10,pEVar17,pEVar11);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar18 = (ExprBase *)CONCAT44(extraout_var_08,iVar7);
            pSVar10 = pEVar11->source;
            pTVar23 = ctx->typeVoid;
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var14 = (_func_int **)CONCAT44(extraout_var_09,iVar7);
            *pp_Var14 = (_func_int *)0x0;
            pp_Var14[1] = (_func_int *)pVVar16;
            pp_Var14[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var14 + 3) = 0;
            pEVar18->typeID = 0x1e;
            pEVar18->source = pSVar10;
            pEVar18->type = pTVar23;
            pEVar18->next = (ExprBase *)0x0;
            pEVar18->listed = false;
            pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
            pEVar18[1]._vptr_ExprBase = pp_Var14;
            *(ExprBase **)&pEVar18[1].typeID = pEVar17;
            pSVar10 = pEVar11->source;
            pEVar17 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
            pEVar17 = CreateGetAddress(ctx,pSVar10,pEVar17);
            CreateSequence(ctx,pSVar10,pEVar18,pEVar17);
          }
        }
        else {
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pSVar10 = pEVar11->source;
          pTVar15 = ExpressionContext::GetReferenceType(ctx,pEVar11->type);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          variable = (VariableHandle *)CONCAT44(extraout_var_07,iVar8);
          pVVar16 = (VariableData *)pEVar17[1]._vptr_ExprBase;
          variable->source = pEVar17->source;
          variable->variable = pVVar16;
          variable->next = (VariableHandle *)0x0;
          variable->listed = false;
          ExprGetAddress::ExprGetAddress
                    ((ExprGetAddress *)CONCAT44(extraout_var_06,iVar7),pSVar10,
                     &pTVar15->super_TypeBase,variable);
        }
        pVVar16 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,(SynBase *)ctx_00,ctx->typeInt);
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar16,false);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar18 = (ExprBase *)CONCAT44(extraout_var_10,iVar7);
        pTVar23 = ctx->typeInt;
        pEVar18->typeID = 6;
        pEVar18->source = (SynBase *)ctx_00;
        pEVar18->type = pTVar23;
        pEVar18->next = (ExprBase *)0x0;
        pEVar18->listed = false;
        pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar18[1]._vptr_ExprBase = (_func_int **)0x0;
        pEVar17 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar17,pEVar18);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar18 = (ExprBase *)CONCAT44(extraout_var_11,iVar7);
        pTVar23 = ctx->typeVoid;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var14 = (_func_int **)CONCAT44(extraout_var_12,iVar7);
        *pp_Var14 = (_func_int *)0x0;
        pp_Var14[1] = (_func_int *)pVVar16;
        pp_Var14[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var14 + 3) = 0;
        pEVar18->typeID = 0x1e;
        pEVar18->source = (SynBase *)ctx_00;
        pEVar18->type = pTVar23;
        pEVar18->next = (ExprBase *)0x0;
        pEVar18->listed = false;
        pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
        pEVar18[1]._vptr_ExprBase = pp_Var14;
        *(ExprBase **)&pEVar18[1].typeID = pEVar17;
        IntrusiveList<ExprBase>::push_back(&initializers,pEVar18);
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar16,false);
        pMVar3 = (ctx_00->uniqueDependencies).little[4];
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar13 = (SynIdentifier *)CONCAT44(extraout_var_13,iVar7);
        (pSVar13->super_SynBase).typeID = 4;
        (pSVar13->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar13->super_SynBase).end = (Lexeme *)0x0;
        (pSVar13->super_SynBase).pos.begin = (char *)0x0;
        (pSVar13->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).next + 2) = 0;
        (pSVar13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
        (pSVar13->name).begin = "size";
        (pSVar13->name).end = "";
        pEVar18 = CreateMemberAccess(ctx,(SynBase *)pMVar3,pEVar11,pSVar13,false);
        pEVar17 = CreateBinaryOp(ctx,(SynBase *)ctx_00,SYN_BINARY_OP_LESS,pEVar17,pEVar18);
        IntrusiveList<ExprBase>::push_back(&conditions,pEVar17);
        pTVar15 = ExpressionContext::GetReferenceType(ctx,local_128);
        pMVar3 = (ctx_00->uniqueDependencies).little[3];
        name.end = (char *)pEVar18;
        name.begin = (char *)pMVar3[1].source;
        anon_unknown.dwarf_c6b42::CheckVariableConflict
                  ((anon_unknown_dwarf_c6b42 *)ctx,ctx_00,
                   *(SynBase **)&pMVar3->importedFunctionCount,name);
        uVar9 = anon_unknown.dwarf_c6b42::AllocateVariableInScope
                          (ctx,(SynBase *)ctx_00,(pTVar15->super_TypeBase).alignment,
                           &pTVar15->super_TypeBase);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar19 = (VariableData *)CONCAT44(extraout_var_14,iVar7);
        uVar1 = (pTVar15->super_TypeBase).alignment;
        pSVar13 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
        uVar2 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar2 + 1;
        VariableData::VariableData
                  (pVVar19,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,
                   &pTVar15->super_TypeBase,pSVar13,uVar9,uVar2);
        pVVar19->isReference = true;
        bVar6 = anon_unknown.dwarf_c6b42::IsLookupOnlyVariable(ctx,pVVar19);
        if (bVar6) {
          pVVar19->lookupOnly = true;
        }
        if (iterators.count == iterators.max) {
          SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
        }
        if (iterators.data == (VariableData **)0x0) {
LAB_00185c92:
          __function = 
          "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_00185ca7:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,__function);
        }
        uVar24 = iterators._8_8_ & 0xffffffff;
        iterators.count = iterators.count + 1;
        iterators.data[uVar24] = pVVar19;
        arguments.allocator = ctx->allocator;
        arguments.little[0].source = (SynBase *)0x0;
        arguments.little[0].isExplicit = false;
        arguments.data = arguments.little;
        arguments.little[0].value = (ExprBase *)0x0;
        arguments.little[0].valueFunction = (FunctionData *)0x0;
        arguments.little[0].name = (SynIdentifier *)0x0;
        arguments.little[0].type = (TypeBase *)0x0;
        arguments.count = 0;
        arguments.max = 1;
        pTVar23 = ctx->typeInt;
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar16,false);
        if (arguments.count == arguments.max) {
          SmallArray<ArgumentData,_1U>::grow(&arguments,arguments.count);
        }
        if (arguments.data == (ArgumentData *)0x0) {
          __function = 
          "void SmallArray<ArgumentData, 1>::push_back(const T &) [T = ArgumentData, N = 1]";
          goto LAB_00185ca7;
        }
        uVar24 = (ulong)arguments.count;
        arguments.count = arguments.count + 1;
        arguments.data[uVar24].source = (SynBase *)ctx_00;
        arguments.data[uVar24].isExplicit = false;
        *(undefined4 *)&arguments.data[uVar24].field_0x9 = local_8f;
        *(uint *)&arguments.data[uVar24].field_0xc = CONCAT31(uStack_8b,local_8f._3_1_);
        arguments.data[uVar24].name = (SynIdentifier *)0x0;
        arguments.data[uVar24].type = pTVar23;
        arguments.data[uVar24].value = pEVar17;
        arguments.data[uVar24].valueFunction = (FunctionData *)0x0;
        arguments_00.count = arguments.count;
        arguments_00.data = arguments.data;
        arguments_00._12_4_ = 0;
        in_R8 = (ExprBase *)(ulong)arguments.count;
        pEVar11 = CreateArrayIndex(ctx,(SynBase *)ctx_00,pEVar11,arguments_00);
        if ((pEVar11 == (ExprBase *)0x0) || (pEVar11->typeID != 0x16)) {
          __assert_fail("isType<ExprDereference>(arrayIndex)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2c46,"ExprFor *AnalyzeForEach(ExpressionContext &, SynForEach *)");
        }
        if ((pEVar11 == (ExprBase *)0x0) || (pEVar17 = pEVar11, pEVar11->typeID != 0x16)) {
          pEVar17 = (ExprBase *)0x0;
        }
        if (pEVar17 != (ExprBase *)0x0) {
          pEVar11 = (ExprBase *)pEVar17[1]._vptr_ExprBase;
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar17 = (ExprBase *)CONCAT44(extraout_var_15,iVar7);
        pTVar23 = ctx->typeVoid;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var14 = (_func_int **)CONCAT44(extraout_var_16,iVar7);
        *pp_Var14 = (_func_int *)0x0;
        pp_Var14[1] = (_func_int *)pVVar19;
        pp_Var14[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var14 + 3) = 0;
        pEVar18 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar19,false);
        pEVar11 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar18,pEVar11);
        pEVar17->typeID = 0x1e;
        pEVar17->source = (SynBase *)ctx_00;
        pEVar17->type = pTVar23;
        pEVar17->next = (ExprBase *)0x0;
        pEVar17->listed = false;
        pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
        pEVar17[1]._vptr_ExprBase = pp_Var14;
        *(ExprBase **)&pEVar17[1].typeID = pEVar11;
        IntrusiveList<ExprBase>::push_back(&definitions,pEVar17);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar11 = (ExprBase *)CONCAT44(extraout_var_17,iVar7);
        pTVar23 = ctx->typeInt;
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar16,false);
        pEVar17 = CreateGetAddress(ctx,(SynBase *)ctx_00,pEVar17);
        pEVar11->typeID = 0x10;
        pEVar11->source = (SynBase *)ctx_00;
        pEVar11->type = pTVar23;
        pEVar11->next = (ExprBase *)0x0;
        pEVar11->listed = false;
        pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248cb0;
        pEVar11[1]._vptr_ExprBase = (_func_int **)pEVar17;
        *(undefined1 *)&pEVar11[1].typeID = 1;
        IntrusiveList<ExprBase>::push_back(&increments,pEVar11);
        SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
        goto LAB_0018539f;
      }
      bVar6 = AssertValueExpression(ctx,(SynBase *)ctx_00,pEVar11);
      if (!bVar6) goto LAB_00184928;
      pTVar23 = pEVar11->type;
      if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0x15)) {
        pTVar23 = (TypeBase *)0x0;
      }
      if (pTVar23 == (TypeBase *)0x0) {
        pMVar3 = (ctx_00->uniqueDependencies).little[4];
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar13 = (SynIdentifier *)CONCAT44(extraout_var,iVar7);
        (pSVar13->super_SynBase).typeID = 4;
        (pSVar13->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar13->super_SynBase).end = (Lexeme *)0x0;
        (pSVar13->super_SynBase).pos.begin = (char *)0x0;
        (pSVar13->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).next + 2) = 0;
        (pSVar13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
        (pSVar13->name).begin = "start";
        (pSVar13->name).end = "";
        pEVar17 = CreateMemberAccess(ctx,(SynBase *)pMVar3,pEVar11,pSVar13,false);
        in_R8 = (ExprBase *)0x0;
        pEVar17 = CreateFunctionCall(ctx,pSVar10,pEVar17,(IntrusiveList<TypeHandle>)ZEXT816(0),
                                     (SynCallArgument *)0x0,false);
        pTVar23 = pEVar17->type;
        if (pTVar23 == (TypeBase *)0x0) {
LAB_001849df:
          pTVar23 = (TypeBase *)0x0;
        }
        else {
          if (pTVar23->typeID == 0) goto LAB_00184928;
          if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0x15)) goto LAB_001849df;
        }
        if (pTVar23 != (TypeBase *)0x0) {
          pEVar11 = pEVar17;
        }
      }
      else {
        pEVar17 = (ExprBase *)0x0;
      }
      if (pTVar23 == (TypeBase *)0x0) {
        pVVar16 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,pSVar10,pEVar17->type);
        pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        pEVar11 = CreateAssignment(ctx,pSVar10,pEVar11,pEVar17);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar17 = (ExprBase *)CONCAT44(extraout_var_02,iVar7);
        pTVar23 = ctx->typeVoid;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var14 = (_func_int **)CONCAT44(extraout_var_03,iVar7);
        *pp_Var14 = (_func_int *)0x0;
        pp_Var14[1] = (_func_int *)pVVar16;
        pp_Var14[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var14 + 3) = 0;
        pEVar17->typeID = 0x1e;
        pEVar17->source = pSVar10;
        pEVar17->type = pTVar23;
        pEVar17->next = (ExprBase *)0x0;
        pEVar17->listed = false;
        pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
        pEVar17[1]._vptr_ExprBase = pp_Var14;
        *(ExprBase **)&pEVar17[1].typeID = pEVar11;
        IntrusiveList<ExprBase>::push_back(&initializers,pEVar17);
        pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar13 = (SynIdentifier *)CONCAT44(extraout_var_04,iVar7);
        (pSVar13->super_SynBase).typeID = 4;
        (pSVar13->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar13->super_SynBase).end = (Lexeme *)0x0;
        (pSVar13->super_SynBase).pos.begin = (char *)0x0;
        (pSVar13->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).next + 2) = 0;
        (pSVar13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
        (pSVar13->name).begin = "hasnext";
        (pSVar13->name).end = "";
        pEVar11 = CreateMemberAccess(ctx,pSVar10,pEVar11,pSVar13,false);
        pEVar11 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar11,
                                     (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                     false);
        IntrusiveList<ExprBase>::push_back(&conditions,pEVar11);
        pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar13 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar7);
        (pSVar13->super_SynBase).typeID = 4;
        (pSVar13->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar13->super_SynBase).end = (Lexeme *)0x0;
        (pSVar13->super_SynBase).pos.begin = (char *)0x0;
        (pSVar13->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar13->super_SynBase).next + 2) = 0;
        (pSVar13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
        (pSVar13->name).begin = "next";
        (pSVar13->name).end = "";
        pEVar11 = CreateMemberAccess(ctx,pSVar10,pEVar11,pSVar13,false);
        in_R8 = (ExprBase *)0x0;
        pEVar17 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar11,
                                     (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                     false);
        if ((local_128 == (TypeBase *)0x0) || (local_128 == ctx->typeAuto)) {
          pTVar15 = (TypeRef *)pEVar17->type;
        }
        else {
          pTVar15 = ExpressionContext::GetReferenceType(ctx,local_128);
        }
        if ((pTVar15 != (TypeRef *)0x0) && ((pTVar15->super_TypeBase).typeID == 0))
        goto LAB_0018539f;
        pMVar3 = (ctx_00->uniqueDependencies).little[3];
        name_01.end = (char *)in_R8;
        name_01.begin = (char *)pMVar3[1].source;
        anon_unknown.dwarf_c6b42::CheckVariableConflict
                  ((anon_unknown_dwarf_c6b42 *)ctx,ctx_00,
                   *(SynBase **)&pMVar3->importedFunctionCount,name_01);
        uVar9 = anon_unknown.dwarf_c6b42::AllocateVariableInScope
                          (ctx,(SynBase *)ctx_00,(pTVar15->super_TypeBase).alignment,
                           &pTVar15->super_TypeBase);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar16 = (VariableData *)CONCAT44(extraout_var_24,iVar7);
        uVar1 = (pTVar15->super_TypeBase).alignment;
        in_R8 = (ExprBase *)(ulong)uVar1;
        pSVar13 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
        uVar2 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar2 + 1;
        VariableData::VariableData
                  (pVVar16,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,
                   &pTVar15->super_TypeBase,pSVar13,uVar9,uVar2);
        if (pTVar15 == (TypeRef *)0x0) {
          bVar6 = false;
        }
        else {
          bVar6 = (pTVar15->super_TypeBase).typeID == 0x12;
        }
        pVVar16->isReference = bVar6;
        bVar6 = anon_unknown.dwarf_c6b42::IsLookupOnlyVariable(ctx,pVVar16);
        if (bVar6) {
          pVVar16->lookupOnly = true;
        }
        if (iterators.count == iterators.max) {
          SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
        }
        if (iterators.data == (VariableData **)0x0) goto LAB_00185c92;
        uVar24 = iterators._8_8_ & 0xffffffff;
        iterators.count = iterators.count + 1;
        iterators.data[uVar24] = pVVar16;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar11 = (ExprBase *)CONCAT44(extraout_var_25,iVar7);
        pTVar23 = ctx->typeVoid;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var14 = (_func_int **)CONCAT44(extraout_var_26,iVar7);
        *pp_Var14 = (_func_int *)0x0;
        pp_Var14[1] = (_func_int *)pVVar16;
        pp_Var14[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var14 + 3) = 0;
        pEVar18 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        pEVar17 = CreateAssignment(ctx,pSVar10,pEVar18,pEVar17);
        pEVar11->typeID = 0x1e;
        pEVar11->source = (SynBase *)ctx_00;
        pEVar11->type = pTVar23;
        pEVar11->next = (ExprBase *)0x0;
        pEVar11->listed = false;
        pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
        pEVar11[1]._vptr_ExprBase = pp_Var14;
        *(ExprBase **)&pEVar11[1].typeID = pEVar17;
        this = &definitions;
        goto LAB_00184930;
      }
      pVVar16 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,pSVar10,pEVar11->type);
      pEVar17 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
      pEVar17 = CreateAssignment(ctx,pSVar10,pEVar17,pEVar11);
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar18 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
      pTVar12 = ctx->typeVoid;
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var14 = (_func_int **)CONCAT44(extraout_var_01,iVar7);
      *pp_Var14 = (_func_int *)0x0;
      pp_Var14[1] = (_func_int *)pVVar16;
      pp_Var14[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var14 + 3) = 0;
      pEVar18->typeID = 0x1e;
      pEVar18->source = pSVar10;
      pEVar18->type = pTVar12;
      pEVar18->next = (ExprBase *)0x0;
      pEVar18->listed = false;
      pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
      pEVar18[1]._vptr_ExprBase = pp_Var14;
      *(ExprBase **)&pEVar18[1].typeID = pEVar17;
      IntrusiveList<ExprBase>::push_back(&initializers,pEVar18);
      if ((pEVar11 == (ExprBase *)0x0) || (pEVar11->typeID != 0x26)) {
        pEVar11 = (ExprBase *)0x0;
      }
      if (pEVar11 == (ExprBase *)0x0) {
        in_R8 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        name_02.end = "";
        name_02.begin = "__assertCoroutine";
        pEVar11 = CreateFunctionCall1(ctx,pSVar10,name_02,in_R8,false,true,true);
        IntrusiveList<ExprBase>::push_back(&initializers,pEVar11);
      }
      else if (*(char *)(pEVar11[1]._vptr_ExprBase + 4) == '\0') {
        anon_unknown.dwarf_c6b42::Stop(ctx,(SynBase *)ctx_00,"ERROR: function is not a coroutine");
      }
      if ((local_128 == ctx->typeAuto || local_128 == (TypeBase *)0x0) &&
         (local_128 = (TypeBase *)pTVar23[1]._vptr_TypeBase, local_128 == ctx->typeAuto)) {
        anon_unknown.dwarf_c6b42::Report
                  (ctx,(SynBase *)ctx_00,"ERROR: function type is unresolved at this point");
      }
      else {
        pMVar3 = (ctx_00->uniqueDependencies).little[3];
        name_00.end = (char *)in_R8;
        name_00.begin = (char *)pMVar3[1].source;
        anon_unknown.dwarf_c6b42::CheckVariableConflict
                  ((anon_unknown_dwarf_c6b42 *)ctx,ctx_00,
                   *(SynBase **)&pMVar3->importedFunctionCount,name_00);
        uVar9 = anon_unknown.dwarf_c6b42::AllocateVariableInScope
                          (ctx,(SynBase *)ctx_00,local_128->alignment,local_128);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar19 = (VariableData *)CONCAT44(extraout_var_18,iVar7);
        uVar1 = local_128->alignment;
        pSVar13 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
        uVar2 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar2 + 1;
        VariableData::VariableData
                  (pVVar19,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,local_128,pSVar13,uVar9
                   ,uVar2);
        bVar6 = anon_unknown.dwarf_c6b42::IsLookupOnlyVariable(ctx,pVVar19);
        if (bVar6) {
          pVVar19->lookupOnly = true;
        }
        if (iterators.count == iterators.max) {
          SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
        }
        if (iterators.data == (VariableData **)0x0) goto LAB_00185c92;
        uVar24 = iterators._8_8_ & 0xffffffff;
        iterators.count = iterators.count + 1;
        iterators.data[uVar24] = pVVar19;
        pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        pEVar11 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar11,
                                     (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                     false);
        if (pEVar11 != (ExprBase *)0x0) {
          pTVar15 = ExpressionContext::GetReferenceType(ctx,local_128);
          pEVar17 = pEVar11;
          if (pTVar15 == (TypeRef *)pEVar11->type) {
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar17 = (ExprBase *)CONCAT44(extraout_var_19,iVar7);
            pEVar17->typeID = 0x16;
            pEVar17->source = (SynBase *)ctx_00;
            pEVar17->type = local_128;
            pEVar17->next = (ExprBase *)0x0;
            pEVar17->listed = false;
            pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a80;
            pEVar17[1]._vptr_ExprBase = (_func_int **)pEVar11;
          }
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_20,iVar7);
          pTVar23 = ctx->typeVoid;
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var14 = (_func_int **)CONCAT44(extraout_var_21,iVar7);
          *pp_Var14 = (_func_int *)0x0;
          pp_Var14[1] = (_func_int *)pVVar19;
          pp_Var14[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var14 + 3) = 0;
          pEVar18 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar19,false);
          pEVar17 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar18,pEVar17);
          pEVar11->typeID = 0x1e;
          pEVar11->source = (SynBase *)ctx_00;
          pEVar11->type = pTVar23;
          pEVar11->next = (ExprBase *)0x0;
          pEVar11->listed = false;
          pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
          pEVar11[1]._vptr_ExprBase = pp_Var14;
          *(ExprBase **)&pEVar11[1].typeID = pEVar17;
          IntrusiveList<ExprBase>::push_back(&initializers,pEVar11);
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar11 = (ExprBase *)CONCAT44(extraout_var_22,iVar7);
        pTVar23 = ctx->typeBool;
        pEVar17 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        name_03.end = "";
        name_03.begin = "isCoroutineReset";
        pEVar17 = CreateFunctionCall1(ctx,(SynBase *)ctx_00,name_03,pEVar17,false,false,true);
        pEVar11->typeID = 0x13;
        pEVar11->source = (SynBase *)ctx_00;
        pEVar11->type = pTVar23;
        pEVar11->next = (ExprBase *)0x0;
        pEVar11->listed = false;
        pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248d20;
        *(undefined4 *)&pEVar11->field_0x2c = 4;
        pEVar11[1]._vptr_ExprBase = (_func_int **)pEVar17;
        IntrusiveList<ExprBase>::push_back(&conditions,pEVar11);
        pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar16,false);
        in_R8 = (ExprBase *)0x0;
        pEVar11 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar11,
                                     (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                     false);
        if (pEVar11 != (ExprBase *)0x0) {
          pTVar15 = ExpressionContext::GetReferenceType(ctx,local_128);
          pEVar17 = pEVar11;
          if (pTVar15 == (TypeRef *)pEVar11->type) {
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar17 = (ExprBase *)CONCAT44(extraout_var_23,iVar7);
            pEVar17->typeID = 0x16;
            pEVar17->source = (SynBase *)ctx_00;
            pEVar17->type = local_128;
            pEVar17->next = (ExprBase *)0x0;
            pEVar17->listed = false;
            pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a80;
            pEVar17[1]._vptr_ExprBase = (_func_int **)pEVar11;
          }
          pEVar11 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar19,false);
          pEVar11 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar11,pEVar17);
          IntrusiveList<ExprBase>::push_back(&increments,pEVar11);
        }
      }
    }
    else {
LAB_00184928:
      this = &initializers;
LAB_00184930:
      IntrusiveList<ExprBase>::push_back(this,pEVar11);
    }
LAB_0018539f:
    ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
    if ((ctx_00 == (ExpressionContext *)0x0) ||
       (*(int *)&((InplaceStr *)&ctx_00->code)->begin != 0x29)) {
      ctx_00 = (ExpressionContext *)0x0;
    }
  }
  if (iterators.count != 0) {
    uVar24 = 0;
    do {
      ExpressionContext::AddVariable(ctx,iterators.data[uVar24],true);
      uVar24 = uVar24 + 1;
    } while (uVar24 < (iterators._8_8_ & 0xffffffff));
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar11 = (ExprBase *)CONCAT44(extraout_var_27,iVar7);
  pTVar23 = ctx->typeVoid;
  pEVar11->typeID = 0x36;
  pEVar11->source = &syntax->super_SynBase;
  pEVar11->type = pTVar23;
  pEVar17 = (ExprBase *)0x0;
  pEVar11->next = (ExprBase *)0x0;
  pEVar11->listed = false;
  pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002490a0;
  pEVar11[1]._vptr_ExprBase = (_func_int **)initializers.head;
  *(ExprBase **)&pEVar11[1].typeID = initializers.tail;
  pEVar11[1].source = (SynBase *)0x0;
  if (conditions.head != (ExprBase *)0x0) {
    pEVar17 = (ExprBase *)0x0;
    pEVar18 = conditions.head;
    do {
      pEVar20 = pEVar18;
      if (pEVar17 != (ExprBase *)0x0) {
        pEVar20 = CreateBinaryOp(ctx,&syntax->super_SynBase,SYN_BINARY_OP_LOGICAL_AND,pEVar17,
                                 pEVar18);
      }
      pEVar17 = pEVar20;
      pEVar18 = pEVar18->next;
    } while (pEVar18 != (ExprBase *)0x0);
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar18 = (ExprBase *)CONCAT44(extraout_var_28,iVar7);
  pTVar23 = ctx->typeVoid;
  pEVar18->typeID = 0x36;
  pEVar18->source = &syntax->super_SynBase;
  pEVar18->type = pTVar23;
  pEVar18->next = (ExprBase *)0x0;
  pEVar18->listed = false;
  pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002490a0;
  *(undefined4 *)&pEVar18[1]._vptr_ExprBase = increments.head._0_4_;
  *(undefined4 *)((long)&pEVar18[1]._vptr_ExprBase + 4) = increments.head._4_4_;
  pEVar18[1].typeID = (uint)increments.tail;
  *(undefined4 *)&pEVar18[1].field_0xc = increments.tail._4_4_;
  pEVar18[1].source = (SynBase *)0x0;
  if (syntax->body != (SynBase *)0x0) {
    pEVar20 = AnalyzeStatement(ctx,syntax->body);
    IntrusiveList<ExprBase>::push_back(&definitions,pEVar20);
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar5 = definitions.tail;
  pEVar20 = definitions.head;
  pEVar21 = (ExprBase *)CONCAT44(extraout_var_29,iVar7);
  pTVar23 = ctx->typeVoid;
  pSVar10 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  for (pSVar4 = ctx->scope; (pSVar4 != (ScopeData *)0x0 && (pSVar4->ownerType == (TypeBase *)0x0));
      pSVar4 = pSVar4->scope) {
    onwerFunction = pSVar4->ownerFunction;
    if (onwerFunction != (FunctionData *)0x0) goto LAB_00185b6d;
  }
  onwerFunction = (FunctionData *)0x0;
LAB_00185b6d:
  pSVar10 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar10,onwerFunction,ctx->scope);
  pEVar21->typeID = 0x36;
  pEVar21->source = &syntax->super_SynBase;
  pEVar21->type = pTVar23;
  pEVar21->next = (ExprBase *)0x0;
  pEVar21->listed = false;
  pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002490a0;
  pEVar21[1]._vptr_ExprBase = (_func_int **)pEVar20;
  *(ExprBase **)&pEVar21[1].typeID = pEVar5;
  pEVar21[1].source = pSVar10;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pEVar22 = (ExprFor *)CONCAT44(extraout_var_30,iVar7);
  pTVar23 = ctx->typeVoid;
  (pEVar22->super_ExprBase).typeID = 0x30;
  (pEVar22->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar22->super_ExprBase).type = pTVar23;
  (pEVar22->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar22->super_ExprBase).listed = false;
  (pEVar22->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002492d0;
  pEVar22->initializer = pEVar11;
  pEVar22->condition = pEVar17;
  pEVar22->increment = pEVar18;
  pEVar22->body = pEVar21;
  SmallArray<VariableData_*,_4U>::~SmallArray(&iterators);
  return pEVar22;
}

Assistant:

ExprFor* AnalyzeForEach(ExpressionContext &ctx, SynForEach *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> initializers;
	IntrusiveList<ExprBase> conditions;
	IntrusiveList<ExprBase> definitions;
	IntrusiveList<ExprBase> increments;

	SmallArray<VariableData*, 4> iterators(ctx.allocator);

	for(SynForEachIterator *curr = syntax->iterators.head; curr; curr = getType<SynForEachIterator>(curr->next))
	{
		SynBase *sourceInternal = ctx.MakeInternal(curr);

		ExprBase *value = AnalyzeExpression(ctx, curr->value);

		if(isType<TypeError>(value->type))
		{
			initializers.push_back(value);
			continue;
		}

		TypeBase *type = NULL;

		if(curr->type)
			type = AnalyzeType(ctx, curr->type);

		if(isType<TypeError>(type))
		{
			initializers.push_back(value);
			continue;
		}

		// Special implementation of for each for built-in arrays
		if(isType<TypeArray>(value->type) || isType<TypeUnsizedArray>(value->type))
		{
			if(!type || type == ctx.typeAuto)
			{
				if(TypeArray *valueType = getType<TypeArray>(value->type))
					type = valueType->subType;
				else if(TypeUnsizedArray *valueType = getType<TypeUnsizedArray>(value->type))
					type = valueType->subType;
			}

			ExprBase* wrapped = value;

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(value->source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				wrapped = node->value;
			}
			else if(!isType<TypeRef>(wrapped->type))
			{
				VariableData *storage = AllocateTemporary(ctx, value->source, wrapped->type);

				ExprBase *assignment = CreateAssignment(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(value->source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				wrapped = CreateSequence(ctx, value->source, definition, CreateGetAddress(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false)));
			}

			// Create initializer
			VariableData *iterator = AllocateTemporary(ctx, curr, ctx.typeInt);

			ExprBase *iteratorAssignment = CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false), new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(curr, ctx.typeInt, 0));

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorAssignment));

			// Create condition
			conditions.push_back(CreateBinaryOp(ctx, curr, SYN_BINARY_OP_LESS, CreateVariableAccess(ctx, curr, iterator, false), CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), false)));

			// Create definition
			type = ctx.GetReferenceType(type);

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = true;

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(curr, false, NULL, ctx.typeInt, CreateVariableAccess(ctx, curr, iterator, false)));

			ExprBase *arrayIndex = CreateArrayIndex(ctx, curr, value, arguments);

			assert(isType<ExprDereference>(arrayIndex));

			if(ExprDereference *node = getType<ExprDereference>(arrayIndex))
				arrayIndex = node->value;

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), arrayIndex)));

			// Create increment
			increments.push_back(new (ctx.get<ExprPreModify>()) ExprPreModify(curr, ctx.typeInt, CreateGetAddress(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false)), true));
			continue;
		}

		if(!AssertValueExpression(ctx, curr, value))
		{
			initializers.push_back(value);
			continue;
		}

		TypeFunction *functionType = getType<TypeFunction>(value->type);
		ExprBase *startCall = NULL;
		
		// If we don't have a function, get an iterator
		if(!functionType)
		{
			startCall = CreateFunctionCall(ctx, sourceInternal, CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("start")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(isType<TypeError>(startCall->type))
			{
				initializers.push_back(value);
				continue;
			}

			// Check if iteartor is a coroutine
			functionType = getType<TypeFunction>(startCall->type);

			if(functionType)
				value = startCall;
		}

		if(functionType)
		{
			// Store function pointer in a variable
			VariableData *functPtr = AllocateTemporary(ctx, sourceInternal, value->type);

			ExprBase *funcPtrInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, functPtr, false), value);

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, functPtr), funcPtrInitializer));

			if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(value))
			{
				if(!access->function->coroutine)
					Stop(ctx, curr, "ERROR: function is not a coroutine");
			}
			else
			{
				initializers.push_back(CreateFunctionCall1(ctx, sourceInternal, InplaceStr("__assertCoroutine"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, true, true));
			}

			// Create definition
			if(!type || type == ctx.typeAuto)
			{
				if(functionType->returnType == ctx.typeAuto)
				{
					Report(ctx, curr, "ERROR: function type is unresolved at this point");

					continue;
				}

				type = functionType->returnType;
			}

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call)));
			}

			// Create condition
			conditions.push_back(new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(curr, ctx.typeBool, SYN_UNARY_OP_LOGICAL_NOT, CreateFunctionCall1(ctx, curr, InplaceStr("isCoroutineReset"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, false, true)));

			// Create increment
			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				increments.push_back(CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call));
			}
		}
		else
		{
			// Store iterator in a variable
			VariableData *iterator = AllocateTemporary(ctx, sourceInternal, startCall->type);

			ExprBase *iteratorInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), startCall);
			
			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorInitializer));

			// Create condition
			conditions.push_back(CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("hasnext")), false), IntrusiveList<TypeHandle>(), NULL, false));

			// Create definition
			ExprBase *call = CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("next")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(!type || type == ctx.typeAuto)
				type = call->type;
			else
				type = ctx.GetReferenceType(type);

			if(isType<TypeError>(type))
				continue;

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = isType<TypeRef>(type);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, variable, false), call)));
		}
	}

	for(unsigned i = 0; i < iterators.size(); i++)
		ctx.AddVariable(iterators[i], true);

	ExprBase *initializer = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, initializers, NULL);

	ExprBase *condition = NULL;

	for(ExprBase *curr = conditions.head; curr; curr = curr->next)
	{
		if(!condition)
			condition = curr;
		else
			condition = CreateBinaryOp(ctx, syntax, SYN_BINARY_OP_LOGICAL_AND, condition, curr);
	}

	ExprBase *increment = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, increments, NULL);

	if(syntax->body)
		definitions.push_back(AnalyzeStatement(ctx, syntax->body));

	ExprBase *body = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, definitions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, increment, body);
}